

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O2

void __thiscall
OpenMD::InversePowerSeries::addExplicitInteraction
          (InversePowerSeries *this,AtomType *atype1,AtomType *atype2,
          vector<int,_std::allocator<int>_> *powers,
          vector<double,_std::allocator<double>_> *coefficients)

{
  int iVar1;
  int iVar2;
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  *this_00;
  long lVar3;
  size_type __new_size;
  long lVar4;
  InversePowerSeriesInteractionData mixer;
  InversePowerSeriesInteractionData local_58;
  
  local_58.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.powers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.powers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.powers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&local_58.powers,powers);
  std::vector<double,_std::allocator<double>_>::operator=(&local_58.coefficients,coefficients);
  iVar1 = AtomType::getIdent(atype1);
  iVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1];
  lVar4 = (long)iVar1;
  iVar2 = AtomType::getIdent(atype2);
  iVar2 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  lVar3 = (long)iVar2;
  __new_size = (size_type)
               (int)(this->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::resize(this_00,__new_size);
  std::
  vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
  ::resize((this_00->
           super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + lVar4,__new_size);
  InversePowerSeriesInteractionData::operator=
            ((InversePowerSeriesInteractionData *)
             (lVar3 * 0x30 +
             *(long *)&(this_00->
                       super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar4].
                       super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                       ._M_impl.super__Vector_impl_data),&local_58);
  if (iVar2 != iVar1) {
    std::
    vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
    ::resize((this_00->
             super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + lVar3,__new_size);
    InversePowerSeriesInteractionData::operator=
              ((InversePowerSeriesInteractionData *)
               (lVar4 * 0x30 +
               *(long *)&(this_00->
                         super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar3].
                         super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                         ._M_impl.super__Vector_impl_data),&local_58);
  }
  InversePowerSeriesInteractionData::~InversePowerSeriesInteractionData(&local_58);
  return;
}

Assistant:

void InversePowerSeries::addExplicitInteraction(
      AtomType* atype1, AtomType* atype2, std::vector<int> powers,
      std::vector<RealType> coefficients) {
    InversePowerSeriesInteractionData mixer;
    mixer.powers       = powers;
    mixer.coefficients = coefficients;

    int ipstid1             = InversePowerSeriesTids[atype1->getIdent()];
    int ipstid2             = InversePowerSeriesTids[atype2->getIdent()];
    int nInversePowerSeries = InversePowerSeriesTypes.size();

    MixingMap.resize(nInversePowerSeries);
    MixingMap[ipstid1].resize(nInversePowerSeries);

    MixingMap[ipstid1][ipstid2] = mixer;
    if (ipstid2 != ipstid1) {
      MixingMap[ipstid2].resize(nInversePowerSeries);
      MixingMap[ipstid2][ipstid1] = mixer;
    }
  }